

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidgetItem::setData(QTableWidgetItem *this,int role,QVariant *value)

{
  long lVar1;
  initializer_list<int> args;
  initializer_list<int> args_00;
  bool bVar2;
  QTableModel *this_00;
  qsizetype qVar3;
  const_reference pQVar4;
  reference pQVar5;
  rvalue_ref t;
  QTableModel *pQVar6;
  QTableWidgetItem *in_RDX;
  int in_ESI;
  size_type in_RDI;
  long in_FS_OFFSET;
  QTableModel *model;
  int i;
  bool found;
  QList<int> roles;
  QVariant *in_stack_ffffffffffffff38;
  QTableWidgetItem *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  int iVar7;
  QTableWidgetItem *in_stack_ffffffffffffff68;
  int local_78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if (in_ESI == 2) {
    in_ESI = 0;
  }
  local_78 = 0;
  iVar7 = in_ESI;
  do {
    this_00 = (QTableModel *)(long)local_78;
    qVar3 = QList<QWidgetItemData>::size((QList<QWidgetItemData> *)(in_RDI + 0x10));
    if (qVar3 <= (long)this_00) {
LAB_008d8caa:
      if (!bVar2) {
        t = (rvalue_ref)(in_RDI + 0x10);
        QWidgetItemData::QWidgetItemData
                  ((QWidgetItemData *)in_stack_ffffffffffffff40,(int)((ulong)t >> 0x20),
                   (QVariant *)0x8d8cd4);
        QList<QWidgetItemData>::append((QList<QWidgetItemData> *)in_stack_ffffffffffffff40,t);
        QWidgetItemData::~QWidgetItemData((QWidgetItemData *)0x8d8cf2);
      }
      pQVar6 = tableModel(in_stack_ffffffffffffff40);
      if (pQVar6 != (QTableModel *)0x0) {
        if (in_ESI == 0) {
          args._M_array._4_4_ = iVar7;
          args._M_array._0_4_ = in_stack_ffffffffffffff50;
          args._M_len = in_RDI;
          QList<int>::QList((QList<int> *)this_00,args);
        }
        else {
          in_stack_ffffffffffffff68 = (QTableWidgetItem *)0x1;
          args_00._M_array._4_4_ = iVar7;
          args_00._M_array._0_4_ = in_stack_ffffffffffffff50;
          args_00._M_len = in_RDI;
          QList<int>::QList((QList<int> *)this_00,args_00);
        }
        QTableModel::itemChanged
                  (this_00,in_stack_ffffffffffffff68,(QList<int> *)in_stack_ffffffffffffff40);
        QList<int>::~QList((QList<int> *)0x8d8dd0);
      }
LAB_008d8dd0:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    pQVar4 = QList<QWidgetItemData>::at
                       ((QList<QWidgetItemData> *)in_stack_ffffffffffffff40,
                        (qsizetype)in_stack_ffffffffffffff38);
    if (pQVar4->role == in_ESI) {
      QList<QWidgetItemData>::operator[]
                ((QList<QWidgetItemData> *)in_stack_ffffffffffffff40,
                 (qsizetype)in_stack_ffffffffffffff38);
      bVar2 = ::operator==((QVariant *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (bVar2) goto LAB_008d8dd0;
      pQVar5 = QList<QWidgetItemData>::operator[]
                         ((QList<QWidgetItemData> *)in_RDX,(qsizetype)in_stack_ffffffffffffff38);
      ::QVariant::operator=(&pQVar5->value,(QVariant *)in_RDX);
      bVar2 = true;
      in_stack_ffffffffffffff40 = in_RDX;
      goto LAB_008d8caa;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void QTableWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < values.size(); ++i) {
        if (values.at(i).role == role) {
            if (values[i].value == value)
                return;

            values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        values.append(QWidgetItemData(role, value));
    if (QTableModel *model = tableModel())
    {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}